

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.hpp
# Opt level: O1

string_view __thiscall mg::data::MappedMrg::entry_data(MappedMrg *this,int index)

{
  pointer pPVar1;
  ulong uVar2;
  char *pcVar3;
  string_view sVar4;
  
  uVar2 = (ulong)index;
  pPVar1 = (this->_entries).
           super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->_entries).
                            super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3)) {
    sVar4._M_len = (ulong)pPVar1[uVar2].size_sectors << 0xb;
    sVar4._M_str = ((this->_backing_data).
                    super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _data + (ulong)pPVar1[uVar2].offset * 0x800;
    return sVar4;
  }
  pcVar3 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  *(long **)pcVar3 = (long *)((long)pcVar3 + 0x10);
  std::__cxx11::string::_M_construct<char*>();
  sVar4 = (string_view)
          std::filesystem::__cxx11::path::_List::_List
                    ((_List *)((long)pcVar3 + 0x20),(_List *)(uVar2 + 0x20));
  return sVar4;
}

Assistant:

const std::string_view entry_data(int index) const {
    const auto &entry = _entries.at(index);
    const size_t offset_bytes = (size_t)entry.offset * (size_t)Mrg::SECTOR_SIZE;
    const unsigned size_bytes = entry.size_sectors * Mrg::SECTOR_SIZE;
    return std::string_view(
        reinterpret_cast<const char *>(_backing_data->data()) + offset_bytes,
        size_bytes);
  }